

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

void proxy_activate(ProxySocket *ps)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ptrlen pVar4;
  void *local_40;
  ptrlen data_1;
  ptrlen data;
  size_t output_after;
  size_t output_before;
  ProxySocket *ps_local;
  
  proxy_negotiator_cleanup(ps);
  plug_log(ps->plug,2,(SockAddr *)0x0,0,(char *)0x0,0);
  sk_set_frozen(ps->sub_socket,true);
  sVar1 = bufchain_size(&ps->pending_oob_output_data);
  sVar2 = bufchain_size(&ps->pending_output_data);
  data.len = 0;
  while (sVar3 = bufchain_size(&ps->pending_oob_output_data), sVar3 != 0) {
    pVar4 = bufchain_prefix(&ps->pending_oob_output_data);
    data_1.len = (size_t)pVar4.ptr;
    data.ptr = (void *)pVar4.len;
    sVar3 = sk_write_oob(ps->sub_socket,(void *)data_1.len,(size_t)data.ptr);
    data.len = sVar3 + data.len;
    bufchain_consume(&ps->pending_oob_output_data,(size_t)data.ptr);
  }
  while (sVar3 = bufchain_size(&ps->pending_output_data), sVar3 != 0) {
    pVar4 = bufchain_prefix(&ps->pending_output_data);
    local_40 = pVar4.ptr;
    data_1.ptr = (void *)pVar4.len;
    sVar3 = sk_write(ps->sub_socket,local_40,(size_t)data_1.ptr);
    data.len = sVar3 + data.len;
    bufchain_consume(&ps->pending_output_data,(size_t)data_1.ptr);
  }
  if (data.len < sVar1 + sVar2) {
    plug_sent(ps->plug,data.len);
  }
  if ((ps->pending_eof & 1U) != 0) {
    sk_write_eof(ps->sub_socket);
  }
  if ((ps->freeze & 1U) == 0) {
    sk_set_frozen(&ps->sock,false);
  }
  return;
}

Assistant:

void proxy_activate(ProxySocket *ps)
{
    size_t output_before, output_after;

    proxy_negotiator_cleanup(ps);

    plug_log(ps->plug, PLUGLOG_CONNECT_SUCCESS, NULL, 0, NULL, 0);

    /* we want to ignore new receive events until we have sent
     * all of our buffered receive data.
     */
    sk_set_frozen(ps->sub_socket, true);

    /* how many bytes of output have we buffered? */
    output_before = bufchain_size(&ps->pending_oob_output_data) +
        bufchain_size(&ps->pending_output_data);
    /* and keep track of how many bytes do not get sent. */
    output_after = 0;

    /* send buffered OOB writes */
    while (bufchain_size(&ps->pending_oob_output_data) > 0) {
        ptrlen data = bufchain_prefix(&ps->pending_oob_output_data);
        output_after += sk_write_oob(ps->sub_socket, data.ptr, data.len);
        bufchain_consume(&ps->pending_oob_output_data, data.len);
    }

    /* send buffered normal writes */
    while (bufchain_size(&ps->pending_output_data) > 0) {
        ptrlen data = bufchain_prefix(&ps->pending_output_data);
        output_after += sk_write(ps->sub_socket, data.ptr, data.len);
        bufchain_consume(&ps->pending_output_data, data.len);
    }

    /* if we managed to send any data, let the higher levels know. */
    if (output_after < output_before)
        plug_sent(ps->plug, output_after);

    /* if we have a pending EOF to send, send it */
    if (ps->pending_eof) sk_write_eof(ps->sub_socket);

    /* if the backend wanted the socket unfrozen, try to unfreeze.
     * our set_frozen handler will flush buffered receive data before
     * unfreezing the actual underlying socket.
     */
    if (!ps->freeze)
        sk_set_frozen(&ps->sock, false);
}